

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Serial.cpp
# Opt level: O3

int __thiscall axl::io::Serial::open(Serial *this,char *__file,int __oflag,...)

{
  int iVar1;
  
  iVar1 = ((__oflag & 2U) == 0) + 1;
  if ((__oflag & 1U) != 0) {
    iVar1 = 0;
  }
  iVar1 = psx::Serial::open(&this->m_serial,__file,iVar1 + (__oflag & 0x100U) * 8 + 0x100);
  return iVar1;
}

Assistant:

bool
Serial::open(
	const sl::StringRef& name,
	uint_t flags
) {
	uint_t posixFlags =
		(flags & FileFlag_ReadOnly) ? O_RDONLY :
		(flags & FileFlag_WriteOnly) ? O_WRONLY : O_RDWR;

	if (flags & FileFlag_Asynchronous)
		posixFlags |= O_NONBLOCK;

	posixFlags |= O_NOCTTY;

	return m_serial.open(name, posixFlags);
}